

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

Node * __thiscall
icu_63::UCharsTrieBuilder::createLinearMatchNode
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t length,Node *nextNode)

{
  UCTLinearMatchNode *this_00;
  undefined4 in_register_00000034;
  UCTLinearMatchNode *pUVar1;
  UnicodeString local_70;
  
  this_00 = (UCTLinearMatchNode *)
            UMemory::operator_new((UMemory *)0x30,CONCAT44(in_register_00000034,i));
  if (this_00 == (UCTLinearMatchNode *)0x0) {
    pUVar1 = (UCTLinearMatchNode *)0x0;
  }
  else {
    UCharsTrieElement::getString(&local_70,this->elements + i,&this->strings);
    if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
      }
    }
    else {
      local_70.fUnion.fFields.fArray = (char16_t *)0x0;
    }
    UCTLinearMatchNode::UCTLinearMatchNode
              (this_00,(char16_t *)((long)local_70.fUnion.fFields.fArray + (long)unitIndex * 2),
               length,nextNode);
    pUVar1 = this_00;
  }
  if (this_00 != (UCTLinearMatchNode *)0x0) {
    UnicodeString::~UnicodeString(&local_70);
  }
  return (Node *)pUVar1;
}

Assistant:

StringTrieBuilder::Node *
UCharsTrieBuilder::createLinearMatchNode(int32_t i, int32_t unitIndex, int32_t length,
                                         Node *nextNode) const {
    return new UCTLinearMatchNode(
            elements[i].getString(strings).getBuffer()+unitIndex,
            length,
            nextNode);
}